

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void anon_unknown.dwarf_164fc7f::processOptions
               (cmGeneratorTarget *tgt,EvaluatedTargetPropertyEntries *entries,
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *options,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *uniqueOptions,bool debugOptions,char *logName,OptionsParse parse,
               bool processDeviceOptions)

{
  cmListFileBacktrace *__args_1;
  char *__s;
  pointer pbVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  long *plVar5;
  reference pvVar6;
  size_t sVar7;
  cmake *this;
  undefined8 *puVar8;
  string *psVar9;
  ulong *puVar10;
  long *plVar11;
  size_type *psVar12;
  string *o;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  size_type __rlen;
  ulong uVar14;
  undefined7 in_register_00000081;
  pointer __args;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar15;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string usedOptions;
  undefined1 local_168 [36];
  uint local_144;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined4 local_114;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  cmGeneratorTarget *local_90;
  pointer local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  pointer local_38;
  
  local_114 = (undefined4)CONCAT71(in_register_00000081,debugOptions);
  local_88 = (entries->Entries).
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (entries->Entries).
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_88 != local_38) {
    local_144 = (uint)CONCAT71((int7)((ulong)local_38 >> 8),processDeviceOptions) ^ 1;
    local_140 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)options
    ;
    local_90 = tgt;
    local_40 = logName;
    do {
      local_b0 = &local_a0;
      local_a8 = 0;
      local_a0 = 0;
      __args = (local_88->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (local_88->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__args != pbVar1) {
        __args_1 = &local_88->Backtrace;
        do {
          if (processDeviceOptions) {
            pcVar2 = (__args->_M_dataplus)._M_p;
            sVar7 = __args->_M_string_length;
            if (((sVar7 != (anonymous_namespace)::DL_BEGIN) ||
                ((sVar7 != 0 && (iVar4 = bcmp(pcVar2,DAT_009d40b0,sVar7), iVar4 != 0)))) &&
               ((sVar7 != (anonymous_namespace)::DL_END ||
                ((sVar7 != 0 && (iVar4 = bcmp(pcVar2,DAT_009d40c0,sVar7), iVar4 != 0))))))
            goto LAB_003e01c3;
            pvVar6 = std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                     ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                               (local_140,__args,__args_1);
            sVar7 = __args->_M_string_length;
            if (sVar7 == (anonymous_namespace)::DL_BEGIN) {
              if (sVar7 == 0) {
                local_144 = (uint)CONCAT71((int7)((ulong)pvVar6 >> 8),1);
              }
              else {
                iVar4 = bcmp((__args->_M_dataplus)._M_p,DAT_009d40b0,sVar7);
                local_144 = CONCAT31((int3)((uint)iVar4 >> 8),iVar4 == 0);
              }
            }
            else {
              local_144 = 0;
            }
          }
          else {
LAB_003e01c3:
            local_168._0_8_ = uniqueOptions;
            pVar15 = std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)uniqueOptions,__args,local_168);
            if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (parse == Shell) {
                local_168._8_8_ = (__args->_M_dataplus)._M_p;
                local_168._0_8_ = __args->_M_string_length;
                __str._M_str = "SHELL:";
                __str._M_len = 6;
                iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_168,0,6
                                   ,__str);
                if (iVar4 != 0) goto LAB_003e021d;
                if ((local_144 & 1) == 0) {
                  pcVar2 = (__args->_M_dataplus)._M_p;
                  __s = pcVar2 + 6;
                  local_168._0_8_ = local_168 + 0x10;
                  sVar7 = strlen(__s);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_168,__s,pcVar2 + sVar7 + 6);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                            (local_140,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_168,__args_1);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_168._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_168 + 0x10)) {
                    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
                  }
                }
                else {
                  local_168._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_168._8_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_168._16_8_ = (__buckets_ptr)0x0;
                  cmSystemTools::ParseUnixCommandLine
                            ((__args->_M_dataplus)._M_p + 6,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_168);
                  uVar3 = local_168._8_8_;
                  for (pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_168._0_8_;
                      pbVar13 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3;
                      pbVar13 = pbVar13 + 1) {
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                              (local_140,pbVar13,__args_1);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_168);
                }
              }
              else {
LAB_003e021d:
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                          (local_140,__args,__args_1);
              }
              if ((char)local_114 != '\0') {
                std::operator+(&local_138," * ",__args);
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
                local_168._0_8_ = local_168 + 0x10;
                pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (plVar5 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5 ==
                    pbVar13) {
                  local_168._16_8_ = ((_Hashtable *)&pbVar13->_M_dataplus)->_M_buckets;
                  local_168._24_8_ = plVar5[3];
                }
                else {
                  local_168._16_8_ = ((_Hashtable *)&pbVar13->_M_dataplus)->_M_buckets;
                  local_168._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
                }
                local_168._8_8_ = plVar5[1];
                *plVar5 = (long)pbVar13;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_b0,local_168._0_8_);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_168._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_168 + 0x10)) {
                  operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
          __args = __args + 1;
        } while (__args != pbVar1);
      }
      if (local_a8 != 0) {
        this = cmLocalGenerator::GetCMakeInstance(local_90->LocalGenerator);
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Used ","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_60);
        puVar10 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar10) {
          local_c0 = *puVar10;
          uStack_b8 = (undefined4)plVar5[3];
          uStack_b4 = *(undefined4 *)((long)plVar5 + 0x1c);
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *puVar10;
          local_d0 = (ulong *)*plVar5;
        }
        local_c8 = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_110 = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110," for target ","");
        uVar14 = 0xf;
        if (local_d0 != &local_c0) {
          uVar14 = local_c0;
        }
        if (uVar14 < (ulong)(local_108 + local_c8)) {
          uVar14 = 0xf;
          if (local_110 != local_100) {
            uVar14 = local_100[0];
          }
          if (uVar14 < (ulong)(local_108 + local_c8)) goto LAB_003e054e;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_d0);
        }
        else {
LAB_003e054e:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_110)
          ;
        }
        plVar5 = puVar8 + 2;
        if ((long *)*puVar8 == plVar5) {
          local_e0 = *plVar5;
          uStack_d8 = puVar8[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar5;
          local_f0 = (long *)*puVar8;
        }
        local_e8 = puVar8[1];
        *puVar8 = plVar5;
        puVar8[1] = 0;
        *(undefined1 *)plVar5 = 0;
        psVar9 = cmTarget::GetName_abi_cxx11_(local_90->Target);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_f0,(ulong)(psVar9->_M_dataplus)._M_p);
        local_80 = &local_70;
        plVar11 = plVar5 + 2;
        if ((long *)*plVar5 == plVar11) {
          local_70 = *plVar11;
          lStack_68 = plVar5[3];
        }
        else {
          local_70 = *plVar11;
          local_80 = (long *)*plVar5;
        }
        local_78 = plVar5[1];
        *plVar5 = (long)plVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
        psVar12 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_138.field_2._M_allocated_capacity = *psVar12;
          local_138.field_2._8_8_ = plVar5[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar12;
          local_138._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_138._M_string_length = plVar5[1];
        *plVar5 = (long)psVar12;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_b0);
        local_168._0_8_ = local_168 + 0x10;
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5 == pbVar13)
        {
          local_168._16_8_ = ((_Hashtable *)&pbVar13->_M_dataplus)->_M_buckets;
          local_168._24_8_ = plVar5[3];
        }
        else {
          local_168._16_8_ = ((_Hashtable *)&pbVar13->_M_dataplus)->_M_buckets;
          local_168._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
        }
        local_168._8_8_ = plVar5[1];
        *plVar5 = (long)pbVar13;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        cmake::IssueMessage(this,LOG,(string *)local_168,&local_88->Backtrace);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x10))
        {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_110 != local_100) {
          operator_delete(local_110,local_100[0] + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
      }
      local_88 = local_88 + 1;
    } while (local_88 != local_38);
  }
  return;
}

Assistant:

void processOptions(cmGeneratorTarget const* tgt,
                    EvaluatedTargetPropertyEntries const& entries,
                    std::vector<BT<std::string>>& options,
                    std::unordered_set<std::string>& uniqueOptions,
                    bool debugOptions, const char* logName, OptionsParse parse,
                    bool processDeviceOptions = false)
{
  bool splitOption = !processDeviceOptions;
  for (EvaluatedTargetPropertyEntry const& entry : entries.Entries) {
    std::string usedOptions;
    for (std::string const& opt : entry.Values) {
      if (processDeviceOptions && (opt == DL_BEGIN || opt == DL_END)) {
        options.emplace_back(opt, entry.Backtrace);
        splitOption = opt == DL_BEGIN;
        continue;
      }

      if (uniqueOptions.insert(opt).second) {
        if (parse == OptionsParse::Shell &&
            cmHasLiteralPrefix(opt, "SHELL:")) {
          if (splitOption) {
            std::vector<std::string> tmp;
            cmSystemTools::ParseUnixCommandLine(opt.c_str() + 6, tmp);
            for (std::string& o : tmp) {
              options.emplace_back(std::move(o), entry.Backtrace);
            }
          } else {
            options.emplace_back(std::string(opt.c_str() + 6),
                                 entry.Backtrace);
          }
        } else {
          options.emplace_back(opt, entry.Backtrace);
        }
        if (debugOptions) {
          usedOptions += " * " + opt + "\n";
        }
      }
    }
    if (!usedOptions.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used ") + logName + std::string(" for target ") +
          tgt->GetName() + ":\n" + usedOptions,
        entry.Backtrace);
    }
  }
}